

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffphis(fitsfile *fptr,char *history,int *status)

{
  size_t sVar1;
  char card [81];
  
  if (0 < *status) {
    return *status;
  }
  for (sVar1 = strlen(history); 0 < (int)sVar1; sVar1 = (size_t)((int)sVar1 - 0x48)) {
    builtin_strncpy(card,"HISTORY ",9);
    strncat(card,history,0x48);
    ffprec(fptr,card,status);
    history = history + 0x48;
  }
  return *status;
}

Assistant:

int ffphis( fitsfile *fptr,      /* I - FITS file pointer  */
            const char *history, /* I - history string     */
            int   *status)       /* IO - error status      */
/*
  Write 1 or more HISTORY keywords.  If the history string is too
  long to fit on a single keyword (72 chars) then it will automatically
  be continued on multiple HISTORY keywords.
*/
{
    char card[FLEN_CARD];
    int len, ii;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    len = strlen(history);
    ii = 0;

    for (; len > 0; len -= 72)
    {
        strcpy(card, "HISTORY ");
        strncat(card, &history[ii], 72);
        ffprec(fptr, card, status);
        ii += 72;
    }

    return(*status);
}